

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O2

wchar_t borg_launch_bolt(wchar_t rad,wchar_t dam,wchar_t typ,wchar_t max,wchar_t ammo_location)

{
  byte bVar1;
  loc_conflict grid1;
  loc_conflict grid1_00;
  chunk_conflict *pcVar2;
  long lVar3;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  loc lVar10;
  loc_conflict lVar11;
  int iVar12;
  long lVar13;
  borg_grid *pbVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  _Bool *p_Var18;
  wchar_t x2;
  uint y;
  long lVar19;
  _Bool *p_Var20;
  wchar_t local_d8;
  wchar_t local_b4;
  wchar_t local_b0;
  wchar_t local_a8;
  int local_a4;
  long local_a0;
  wchar_t local_94;
  long local_90;
  _Bool *local_88;
  int local_80;
  int local_7c;
  wchar_t local_78;
  uint local_74;
  wchar_t local_70;
  wchar_t local_6c;
  long local_68;
  _Bool *local_60;
  _Bool *local_58;
  borg_grid *local_50;
  uint local_48;
  wchar_t local_44;
  _Bool *local_40;
  wchar_t *local_38;
  
  local_78 = (wchar_t)z_info->max_range;
  local_48 = ~rad;
  lVar15 = 0;
  local_b4 = L'\xffffffff';
  local_7c = 0;
  local_80 = 0;
  local_b0 = local_b4;
  local_94 = dam;
  local_70 = ammo_location;
  local_6c = max;
  do {
    if (borg_temp_n <= lVar15) {
      if ((local_b4 != L'\xffffffff') && (borg_tp_other_n = 0, borg_simulate == false)) {
        borg.goal.g.x = local_80 + (uint)borg_temp_x[local_b4];
        borg.goal.g.y = local_7c + (uint)borg_temp_y[local_b4];
        lVar11.y = borg.goal.g.y;
        lVar11.x = borg.goal.g.x;
        borg_target(lVar11);
      }
      return local_b0;
    }
    local_74 = local_48;
    local_68 = lVar15;
    for (iVar12 = -1; iVar12 != 2; iVar12 = iVar12 + 1) {
      for (iVar17 = -1; pcVar2 = cave, iVar17 != 2; iVar17 = iVar17 + 1) {
        bVar1 = borg_temp_x[lVar15];
        lVar19 = (long)iVar12 + (ulong)bVar1;
        local_a0 = (long)iVar17 + (ulong)borg_temp_y[lVar15];
        borg_tp_other_n = 0;
        x2 = (wchar_t)lVar19;
        lVar10 = (loc)loc(x2,(int)local_a0);
        _Var4 = square_in_bounds(pcVar2,lVar10);
        lVar13 = lVar15;
        if (_Var4) {
          lVar11 = loc((uint)borg_temp_x[lVar15],(uint)borg_temp_y[lVar15]);
          grid1.y = borg.c.y;
          grid1.x = borg.c.x;
          wVar5 = distance(grid1,lVar11);
          lVar13 = local_68;
          lVar3 = local_a0;
          y = (uint)local_a0;
          if (x2 == (uint)borg_temp_x[lVar15]) {
            if ((typ != L'-') || (y == borg_temp_y[local_68])) {
LAB_001f816b:
              local_44 = wVar5;
              lVar11 = loc(x2,y);
              grid1_00.y = borg.c.y;
              grid1_00.x = borg.c.x;
              wVar6 = distance(grid1_00,lVar11);
              wVar5 = w_x;
              if (wVar6 <= local_6c) {
                if (((L'\x01' < rad) && (borg_grids[lVar3][lVar19].feat != '\0')) ||
                   ((y == borg_temp_y[lVar13] && (x2 == (uint)borg_temp_x[lVar13])))) {
                  wVar7 = borg_panel_wid();
                  wVar9 = w_y;
                  wVar8 = borg_panel_hgt();
                  wVar6 = borg.c.y;
                  pcVar2 = cave;
                  local_88 = (_Bool *)CONCAT44(local_88._4_4_,wVar9 / wVar8);
                  local_50 = (borg_grid *)CONCAT44(local_50._4_4_,borg.c.x);
                  lVar10 = (loc)loc(x2,y);
                  _Var4 = square_in_bounds_fully(pcVar2,lVar10);
                  wVar9 = (wchar_t)local_50;
                  if (_Var4) {
                    local_a8 = (wchar_t)local_50;
                    local_a4 = wVar6;
                    if ((int)(uint)borg_kills[borg_grids[(int)y][x2].kill].r_idx <
                        (int)(z_info->r_max - 1)) {
                      lVar15 = (long)(wVar5 / wVar7);
                      local_58 = borg_detect_wall[(int)local_88] + lVar15 + 1;
                      local_60 = borg_detect_wall[(int)local_88 + 1] + lVar15;
                      local_40 = borg_detect_wall[(int)local_88 + 1] + lVar15 + 1;
                      local_38 = &r_info[borg_kills[borg_grids[(int)y][x2].kill].r_idx].light;
                      local_d8 = L'\0';
                      local_90 = CONCAT44(local_90._4_4_,wVar6);
                      local_88 = borg_detect_wall[(int)local_88] + lVar15;
                      for (wVar5 = L'\x01'; wVar5 < local_6c; wVar5 = wVar5 + L'\x01') {
                        borg_inc_motion(&local_a4,&local_a8,wVar6,wVar9,(wchar_t)local_a0,x2);
                        pcVar2 = cave;
                        lVar10 = (loc)loc(local_a8,local_a4);
                        _Var4 = square_in_bounds_fully(pcVar2,lVar10);
                        if (!_Var4) {
LAB_001f84f5:
                          lVar13 = local_68;
                          if (L'\0' < rad) {
                            local_58 = (_Bool *)(long)(x2 - rad);
                            lVar15 = (long)(rad + x2);
                            local_88 = (_Bool *)(long)((int)local_a0 + rad);
                            local_60 = (_Bool *)((long)(int)(bVar1 + local_74) * 0xc);
                            local_90 = lVar15;
                            for (lVar19 = (long)((int)local_a0 - rad); lVar13 = local_68,
                                p_Var18 = local_60, p_Var20 = local_58, lVar19 < (long)local_88;
                                lVar19 = lVar19 + 1) {
                              for (; pcVar2 = cave, (long)p_Var20 < lVar15; p_Var20 = p_Var20 + 1) {
                                wVar6 = (wchar_t)p_Var20;
                                wVar5 = (wchar_t)lVar19;
                                lVar10 = (loc)loc(wVar6,wVar5);
                                _Var4 = square_in_bounds(pcVar2,lVar10);
                                if (_Var4) {
                                  local_50 = borg_grids[lVar19];
                                  wVar7 = (wchar_t)local_a0;
                                  wVar9 = borg_distance(wVar7,x2,wVar5,wVar6);
                                  lVar15 = local_90;
                                  if ((wVar9 <= rad) &&
                                     (_Var4 = borg_los(wVar7,x2,wVar5,wVar6), pbVar14 = local_50,
                                     lVar15 = local_90, _Var4)) {
                                    iVar16 = wVar9 + L'\x01';
                                    if (rad == L'\n') {
                                      iVar16 = 1;
                                    }
                                    wVar5 = borg_launch_bolt_aux_hack
                                                      ((uint)p_Var18[(long)&local_50->kill],
                                                       local_94 / iVar16,typ,local_70);
                                    lVar15 = local_90;
                                    local_d8 = local_d8 + wVar5;
                                    if (((ulong)p_Var18[(long)&pbVar14->take] != 0) &&
                                       (borg_takes[p_Var18[(long)&pbVar14->take]].kind !=
                                        (object_kind *)0x0)) {
                                      wVar5 = borg_launch_destroy_stuff
                                                        ((borg_grid *)(p_Var18 + (long)pbVar14),typ)
                                      ;
                                      local_d8 = local_d8 - wVar5;
                                    }
                                  }
                                }
                                p_Var18 = p_Var18 + 0xc;
                              }
                            }
                          }
                          goto LAB_001f86ca;
                        }
                        pbVar14 = borg_grids[local_a4] + local_a8;
                        _Var4 = borg_cave_floor_grid(pbVar14);
                        if ((!_Var4) || (pbVar14->feat == '\x18')) {
LAB_001f84d6:
                          if (rad == L'\xffffffff') goto LAB_001f86ca;
joined_r0x001f84ea:
                          if (rad == L'\n') goto LAB_001f86ca;
                          goto LAB_001f86a2;
                        }
                        if (rad == L'\n' || rad < L'\x01') {
                          wVar6 = borg_launch_bolt_aux_hack
                                            ((uint)pbVar14->kill,local_94,typ,local_70);
                          local_d8 = local_d8 + wVar6;
                        }
                        if ((rad != L'\xffffffff') && (rad != L'\n')) {
                          if ((local_a8 == x2) && (local_a4 == (int)local_a0)) goto LAB_001f84f5;
                          if ((rad == L'\0') && (pbVar14->kill != '\0')) goto LAB_001f86ca;
                        }
                        if (borg.trait[0x25] == 0) {
                          if ((borg.trait[0x34] < 1) && (*local_38 < L'\x01')) goto LAB_001f84b8;
                        }
                        else if ((*local_88 == false) &&
                                ((((*local_58 == false && (*local_60 == false)) &&
                                  (*local_40 == false)) &&
                                 ((int)(uint)borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb] <
                                  (int)(avoidance / 0x14))))) {
LAB_001f84b8:
                          if (pbVar14->feat == '\0') goto LAB_001f84d6;
                        }
                        if (successful_target < L'\0') {
                          if ((uint)successful_target < 0xfffffff5) {
                            successful_target = L'\0';
                          }
                          if (rad != L'\xffffffff') goto joined_r0x001f84ea;
                          goto LAB_001f86ca;
                        }
                        wVar6 = (wchar_t)local_90;
                      }
                      if (L'\0' < rad) {
                        local_d8 = L'\0';
                      }
LAB_001f86ca:
                      if ((typ == L'-') && (L'\0' < local_d8)) {
                        local_d8 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
                        local_d8 = local_94 - local_d8;
                      }
                      borg_tp_other_n = 0;
                      if (((((L'\0' < local_d8) && ((int)local_a0 != 0x41)) &&
                           ((x2 != L'Å' && ((x2 != L'\0' && ((int)local_a0 != 0)))))) &&
                          ((local_b4 < L'\0' || (local_b0 <= local_d8)))) &&
                         ((local_d8 != local_b0 || (local_44 <= local_78)))) {
                        local_b4 = (wchar_t)lVar13;
                        local_b0 = local_d8;
                        local_80 = iVar12;
                        local_7c = iVar17;
                        local_78 = local_44;
                      }
                      goto LAB_001f86ae;
                    }
                  }
                }
LAB_001f86a2:
                borg_tp_other_n = 0;
              }
            }
          }
          else if (typ != L'-') goto LAB_001f816b;
        }
LAB_001f86ae:
        lVar15 = lVar13;
      }
      local_74 = local_74 + 1;
    }
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

int borg_launch_bolt(int rad, int dam, int typ, int max, int ammo_location)
{
    int i     = 0;
    int b_i   = -1;
    int n     = 0;
    int b_n   = -1;
    int b_o_y = 0, b_o_x = 0;
    int o_y = 0, o_x = 0;
    int d, b_d       = z_info->max_range;

    /* Examine possible destinations */

    /* This will allow the borg to target places adjacent to a monster
     * in order to exploit and abuse a feature of the game.  Whereas,
     * the borg, while targeting a monster will not score d/t walls, he
     * could land a successful hit by targeting adjacent to the monster.
     * For example:
     * ######################
     * #####....@......######
     * ############Px........
     * ######################
     * In order to hit the P, the borg must target the x and not the P.
     *
     */
    for (i = 0; i < borg_temp_n; i++) {
        int x = borg_temp_x[i];
        int y = borg_temp_y[i];

        /* Consider each adjacent spot to and on top of the monster */
        for (o_x = -1; o_x <= 1; o_x++) {
            for (o_y = -1; o_y <= 1; o_y++) {
                /* Acquire location */
                x = borg_temp_x[i] + o_x;
                y = borg_temp_y[i] + o_y;

                /* Reset Teleport Other variables */
                borg_tp_other_n = 0;
                n               = 0;

                /* Bounds check */
                if (!square_in_bounds(cave, loc(x, y)))
                    continue;

                /* Remember how far away the monster is */
                d = distance(borg.c, loc(borg_temp_x[i], borg_temp_y[i]));

                /* Skip certain types of Offset attacks */
                if ((x != borg_temp_x[i] || y != borg_temp_y[i])
                    && typ == BORG_ATTACK_AWAY_ALL)
                    continue;

                /* Skip places that are out of range */
                if (distance(borg.c, loc(x, y)) > max)
                    continue;

                /* Consider it if its a ball spell or right on top of it */
                if ((rad >= 2 && borg_grids[y][x].feat != FEAT_NONE)
                    || (y == borg_temp_y[i] && x == borg_temp_x[i]))
                    n = borg_launch_bolt_at_location(
                        y, x, rad, dam, typ, max, ammo_location);

                /* Teleport Other is now considered */
                if (typ == BORG_ATTACK_AWAY_ALL && n > 0) {
                    /* Consider danger with certain monsters removed
                     * from the danger check.  They were removed from the list
                     * of considered monsters (borg_tp_other array)
                     */
                    n = borg_danger(borg.c.y, borg.c.x, 1, true, false);

                    /* since this is the danger after monster removal */
                    /* and dam for tel away is the previous danger */
                    /* we want the biggest reduction in danger */
                    n = dam - n;
                }

                /* Reset Teleport Other variables */
                borg_tp_other_n = 0;

                /* Skip useless attacks */
                if (n <= 0)
                    continue;

                /* The game forbids targetting the outside walls */
                if (x == 0 || y == 0 || x == DUNGEON_WID - 1
                    || y == DUNGEON_HGT - 1)
                    continue;

                /* Collect best attack */
                if ((b_i >= 0) && (n < b_n))
                    continue;

                /* Skip attacking farther monster if rewards are equal. */
                if (n == b_n && d > b_d)
                    continue;

                /* Track it */
                b_i   = i;
                b_n   = n;
                b_o_y = o_y;
                b_o_x = o_x;
                b_d   = d;
            }
        }
    }
    if (b_i == -1)
        return b_n;

    /* Reset Teleport Other variables */
    borg_tp_other_n = 0;

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Save the location */
    borg.goal.g.x = borg_temp_x[b_i] + b_o_x;
    borg.goal.g.y = borg_temp_y[b_i] + b_o_y;

    /* Target the location */
    (void)borg_target(borg.goal.g);

    /* Result */
    return b_n;
}